

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

LogEst sqlite3LogEst(u64 x)

{
  short sVar1;
  
  if (x < 8) {
    if (x < 2) {
      return 0;
    }
    sVar1 = 0x28;
    for (; x < 8; x = x * 2) {
      sVar1 = sVar1 + -10;
    }
  }
  else {
    sVar1 = 0x28;
    for (; 0xff < x; x = x >> 4) {
      sVar1 = sVar1 + 0x28;
    }
    for (; 0xf < x; x = x >> 1) {
      sVar1 = sVar1 + 10;
    }
  }
  return sVar1 + sqlite3LogEst::a[(uint)x & 7] + -10;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEst(u64 x){
  static LogEst a[] = { 0, 2, 3, 5, 6, 7, 8, 9 };
  LogEst y = 40;
  if( x<8 ){
    if( x<2 ) return 0;
    while( x<8 ){  y -= 10; x <<= 1; }
  }else{
    while( x>255 ){ y += 40; x >>= 4; }  /*OPTIMIZATION-IF-TRUE*/
    while( x>15 ){  y += 10; x >>= 1; }
  }
  return a[x&7] + y - 10;
}